

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Noise.cpp
# Opt level: O3

void __thiscall chrono::ChFunction_Noise::ArchiveOUT(ChFunction_Noise *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Noise>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_30 = &this->amp;
  local_38 = "amp";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->freq;
  local_38 = "freq";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->amp_ratio;
  local_38 = "amp_ratio";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = (double *)&this->octaves;
  local_38 = "octaves";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Noise::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Noise>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(amp);
    marchive << CHNVP(freq);
    marchive << CHNVP(amp_ratio);
    marchive << CHNVP(octaves);
}